

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_add_obj_info(p_ply_conflict ply,char *obj_info)

{
  size_t sVar1;
  char *__dest;
  
  if ((obj_info != (char *)0x0) && (sVar1 = strlen(obj_info), sVar1 < 0x400)) {
    __dest = (char *)ply_grow_array(ply,&ply->obj_info,&ply->nobj_infos,0x400);
    if (__dest != (char *)0x0) {
      strcpy(__dest,obj_info);
      return 1;
    }
    return 0;
  }
  ply_ferror(ply,"Invalid arguments");
  return 0;
}

Assistant:

int ply_add_obj_info(p_ply ply, const char *obj_info) {
    char *new_obj_info = NULL;
    assert(ply && obj_info && strlen(obj_info) < LINESIZE);
    if (!obj_info || strlen(obj_info) >= LINESIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    new_obj_info = (char *) ply_grow_array(ply, (void **) &ply->obj_info,
            &ply->nobj_infos, LINESIZE);
    if (!new_obj_info) return 0;
    strcpy(new_obj_info, obj_info);
    return 1;
}